

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

uint32_t __thiscall TextReader::read_uint32(TextReader *this,uint32_t min_value,uint32_t max_value)

{
  ulong *puVar1;
  size_type *psVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  undefined8 *puVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  string __str_1;
  string __str;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  ulong *local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  ulong local_c0 [2];
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  load_next_token(this);
  if (this->current_token_type_ == ttDec) {
    if (this->current_token_len_ == 0) {
      uVar12 = 0;
      uVar9 = 0;
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
      do {
        bVar4 = (this->current_line_)._M_dataplus._M_p[uVar11 + this->current_token_pos_];
        if (9 < (byte)(bVar4 - 0x30)) {
          __assert_fail("_is_digit(current_line_[current_token_pos_ + index])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/io/textreader.hpp"
                        ,0x170,"uint32_t TextReader::read_uint32(const uint32_t, const uint32_t)");
        }
        uVar12 = ((ulong)bVar4 + uVar12 * 10) - 0x30;
        if (uVar12 < min_value || max_value < uVar12) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"The unsigned int 32 bit value is out of bounds: ","");
          cVar7 = '\x01';
          if (9 < min_value) {
            uVar10 = min_value;
            cVar6 = '\x04';
            do {
              cVar7 = cVar6;
              if (uVar10 < 100) {
                cVar7 = cVar7 + -2;
                goto LAB_0010bf14;
              }
              if (uVar10 < 1000) {
                cVar7 = cVar7 + -1;
                goto LAB_0010bf14;
              }
              if (uVar10 < 10000) goto LAB_0010bf14;
              bVar5 = 99999 < uVar10;
              uVar10 = uVar10 / 10000;
              cVar6 = cVar7 + '\x04';
            } while (bVar5);
            cVar7 = cVar7 + '\x01';
          }
LAB_0010bf14:
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct((ulong)&local_d0,cVar7);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0,local_c8,min_value);
          uVar9 = 0xf;
          if (local_70 != local_60) {
            uVar9 = local_60[0];
          }
          uVar3 = CONCAT44(uStack_c4,local_c8) + local_68;
          if (uVar9 < uVar3) {
            uVar9 = 0xf;
            if (local_d0 != local_c0) {
              uVar9 = local_c0[0];
            }
            if (uVar9 < uVar3) goto LAB_0010bf91;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_0010bf91:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0);
          }
          local_130 = &local_120;
          puVar1 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar1) {
            local_120 = *puVar1;
            uStack_118 = *(undefined4 *)(puVar8 + 3);
            uStack_114 = *(undefined4 *)((long)puVar8 + 0x1c);
          }
          else {
            local_120 = *puVar1;
            local_130 = (ulong *)*puVar8;
          }
          local_128 = puVar8[1];
          *puVar8 = puVar1;
          puVar8[1] = 0;
          *(undefined1 *)puVar1 = 0;
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"..","");
          uVar9 = 0xf;
          if (local_130 != &local_120) {
            uVar9 = local_120;
          }
          if (uVar9 < (ulong)(local_88 + local_128)) {
            uVar9 = 0xf;
            if (local_90 != local_80) {
              uVar9 = local_80[0];
            }
            if (uVar9 < (ulong)(local_88 + local_128)) goto LAB_0010c079;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
          }
          else {
LAB_0010c079:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90);
          }
          local_110 = &local_100;
          puVar1 = puVar8 + 2;
          if ((ulong *)*puVar8 == puVar1) {
            local_100 = *puVar1;
            uStack_f8 = puVar8[3];
          }
          else {
            local_100 = *puVar1;
            local_110 = (ulong *)*puVar8;
          }
          local_108 = puVar8[1];
          *puVar8 = puVar1;
          puVar8[1] = 0;
          *(undefined1 *)puVar1 = 0;
          cVar7 = '\x01';
          if (9 < max_value) {
            uVar10 = max_value;
            cVar6 = '\x04';
            do {
              cVar7 = cVar6;
              if (uVar10 < 100) {
                cVar7 = cVar7 + -2;
                goto LAB_0010c131;
              }
              if (uVar10 < 1000) {
                cVar7 = cVar7 + -1;
                goto LAB_0010c131;
              }
              if (uVar10 < 10000) goto LAB_0010c131;
              bVar5 = 99999 < uVar10;
              uVar10 = uVar10 / 10000;
              cVar6 = cVar7 + '\x04';
            } while (bVar5);
            cVar7 = cVar7 + '\x01';
          }
LAB_0010c131:
          local_f0 = local_e0;
          std::__cxx11::string::_M_construct((ulong)&local_f0,cVar7);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,local_e8,max_value);
          uVar9 = 0xf;
          if (local_110 != &local_100) {
            uVar9 = local_100;
          }
          uVar3 = CONCAT44(uStack_e4,local_e8) + local_108;
          if (uVar9 < uVar3) {
            uVar9 = 0xf;
            if (local_f0 != local_e0) {
              uVar9 = local_e0[0];
            }
            if (uVar9 < uVar3) goto LAB_0010c1a1;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
          }
          else {
LAB_0010c1a1:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          psVar2 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar2) {
            local_b0.field_2._M_allocated_capacity = *psVar2;
            local_b0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar2;
            local_b0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_b0._M_string_length = puVar8[1];
          *puVar8 = psVar2;
          puVar8[1] = 0;
          *(undefined1 *)psVar2 = 0;
          parse_error(this,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (local_f0 != local_e0) {
            operator_delete(local_f0);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110);
          }
          if (local_90 != local_80) {
            operator_delete(local_90);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
        }
        uVar11 = uVar11 + 1;
        uVar9 = this->current_token_len_;
      } while (uVar11 < uVar9);
    }
    uVar10 = (uint32_t)uVar12;
    this->current_token_pos_ = this->current_token_pos_ + uVar9;
    this->current_token_len_ = 0;
    this->current_token_type_ = ttUnknown;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Expect an unsigned int 32 bit value","");
    parse_error(this,&local_50);
    uVar10 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return uVar10;
}

Assistant:

inline uint32_t read_uint32(const uint32_t min_value = 0, const uint32_t max_value = UINT32_MAX) {
        load_next_token();
        if (current_token_type_ == ttDec) {
            uint64_t result = 0;
            auto index = 0;
            while (index < current_token_len_) {
                // this is checked when parsing the token already
                assert(_is_digit(current_line_[current_token_pos_ + index]));
                result = result * 10 + (current_line_[current_token_pos_ + index] - '0');
                if (result < min_value || result > max_value) {
                    parse_error(std::string("The unsigned int 32 bit value is out of bounds: ") +
                                std::to_string(min_value) + std::string("..") + std::to_string(max_value));
                };
                index++;
            };
            skip_token();
            return (uint32_t)result;
        };
        parse_error("Expect an unsigned int 32 bit value");
        return 0;
    }